

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O3

bool slang::syntax::ProceduralDeassignStatementSyntax::isKind(SyntaxKind kind)

{
  return (kind & ~TokenList) == ProceduralDeassignStatement;
}

Assistant:

bool ProceduralDeassignStatementSyntax::isKind(SyntaxKind kind) {
    switch (kind) {
        case SyntaxKind::ProceduralDeassignStatement:
        case SyntaxKind::ProceduralReleaseStatement:
            return true;
        default:
            return false;
    }
}